

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O2

void HydroUtils::ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Geometry *geom,int ncomp,bool fluxes_are_area_weighted)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  int k;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int j;
  long lVar33;
  ulong uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  
  dVar35 = (geom->super_CoordSys).dx[0];
  dVar1 = (geom->super_CoordSys).dx[1];
  if (fluxes_are_area_weighted) {
    dVar36 = (geom->super_CoordSys).dx[2];
    dVar37 = dVar1 * dVar36;
    dVar36 = dVar36 * dVar35;
  }
  else {
    dVar37 = 1.0;
    dVar36 = 1.0;
  }
  iVar2 = (bx->smallend).vect[0];
  lVar20 = (long)iVar2;
  lVar24 = (long)(bx->smallend).vect[1];
  lVar29 = (long)(bx->smallend).vect[2];
  uVar3 = (bx->btype).itype;
  iVar22 = (~uVar3 & 1) + (bx->bigend).vect[0];
  lVar9 = fx->jstride;
  lVar10 = fx->kstride;
  uVar34 = 0;
  uVar17 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar17 = uVar34;
  }
  iVar4 = (umac->begin).y;
  iVar5 = (umac->begin).z;
  lVar11 = umac->kstride;
  lVar12 = umac->jstride;
  iVar6 = (umac->begin).x;
  pdVar13 = umac->p;
  lVar14 = xed->kstride;
  lVar21 = xed->jstride;
  pdVar23 = fx->p + ((lVar20 + (lVar29 - (fx->begin).z) * lVar10 + (lVar24 - (fx->begin).y) * lVar9)
                    - (long)(fx->begin).x);
  lVar30 = fx->nstride;
  pdVar16 = xed->p + ((lVar20 + (lVar29 - (xed->begin).z) * lVar14 +
                                (lVar24 - (xed->begin).y) * lVar21) - (long)(xed->begin).x);
  lVar32 = xed->nstride;
  iVar7 = (bx->bigend).vect[1];
  iVar8 = (bx->bigend).vect[2];
  for (; lVar15 = lVar29, pdVar18 = pdVar16,
      pdVar25 = pdVar13 + ((lVar20 + (lVar29 - iVar5) * lVar11 + (lVar24 - iVar4) * lVar12) -
                          (long)iVar6), pdVar27 = pdVar23, uVar34 != uVar17; uVar34 = uVar34 + 1) {
    for (; pdVar19 = pdVar18, pdVar26 = pdVar25, pdVar28 = pdVar27, lVar33 = lVar24, lVar15 <= iVar8
        ; lVar15 = lVar15 + 1) {
      for (; lVar33 <= iVar7; lVar33 = lVar33 + 1) {
        if (iVar2 <= iVar22) {
          lVar31 = 0;
          do {
            pdVar28[lVar31] = pdVar19[lVar31] * pdVar26[lVar31] * dVar37;
            lVar31 = lVar31 + 1;
          } while ((iVar22 - iVar2) + 1 != (int)lVar31);
        }
        pdVar28 = pdVar28 + lVar9;
        pdVar26 = pdVar26 + lVar12;
        pdVar19 = pdVar19 + lVar21;
      }
      pdVar18 = pdVar18 + lVar14;
      pdVar25 = pdVar25 + lVar11;
      pdVar27 = pdVar27 + lVar10;
    }
    pdVar23 = pdVar23 + lVar30;
    pdVar16 = pdVar16 + lVar32;
  }
  iVar2 = (bx->smallend).vect[0];
  lVar21 = (long)iVar2;
  lVar30 = (long)(bx->smallend).vect[1];
  lVar32 = (long)(bx->smallend).vect[2];
  iVar22 = (bx->bigend).vect[1];
  lVar9 = fy->jstride;
  lVar10 = fy->kstride;
  lVar20 = vmac->jstride;
  lVar24 = vmac->kstride;
  iVar4 = (vmac->begin).y;
  iVar5 = (vmac->begin).z;
  iVar6 = (vmac->begin).x;
  pdVar13 = vmac->p;
  lVar29 = yed->kstride;
  lVar11 = yed->jstride;
  pdVar16 = fy->p + ((lVar21 + (lVar32 - (fy->begin).z) * lVar10 + (lVar30 - (fy->begin).y) * lVar9)
                    - (long)(fy->begin).x);
  dVar35 = dVar35 * dVar1;
  lVar12 = fy->nstride;
  pdVar23 = yed->p + ((lVar21 + (lVar32 - (yed->begin).z) * lVar29 +
                                (lVar30 - (yed->begin).y) * lVar11) - (long)(yed->begin).x);
  lVar14 = yed->nstride;
  iVar7 = (bx->bigend).vect[0];
  iVar8 = (bx->bigend).vect[2];
  for (uVar34 = 0; pdVar18 = pdVar23, lVar15 = lVar32, pdVar25 = pdVar16,
      pdVar27 = pdVar13 + ((lVar21 + (lVar32 - iVar5) * lVar24 + (lVar30 - iVar4) * lVar20) -
                          (long)iVar6), uVar34 != uVar17; uVar34 = uVar34 + 1) {
    for (; lVar33 = lVar30, pdVar19 = pdVar18, pdVar26 = pdVar25, pdVar28 = pdVar27, lVar15 <= iVar8
        ; lVar15 = lVar15 + 1) {
      for (; lVar33 <= (int)(iVar22 + (uint)((uVar3 & 2) == 0)); lVar33 = lVar33 + 1) {
        if (iVar2 <= iVar7) {
          lVar31 = 0;
          do {
            pdVar26[lVar31] = pdVar19[lVar31] * pdVar28[lVar31] * dVar36;
            lVar31 = lVar31 + 1;
          } while ((iVar7 - iVar2) + 1 != (int)lVar31);
        }
        pdVar26 = pdVar26 + lVar9;
        pdVar28 = pdVar28 + lVar20;
        pdVar19 = pdVar19 + lVar11;
      }
      pdVar18 = pdVar18 + lVar29;
      pdVar25 = pdVar25 + lVar10;
      pdVar27 = pdVar27 + lVar24;
    }
    pdVar16 = pdVar16 + lVar12;
    pdVar23 = pdVar23 + lVar14;
  }
  if (!fluxes_are_area_weighted) {
    dVar35 = 1.0;
  }
  iVar2 = (bx->smallend).vect[0];
  lVar21 = (long)iVar2;
  lVar30 = (long)(bx->smallend).vect[1];
  iVar22 = (bx->bigend).vect[2];
  lVar32 = (long)(bx->smallend).vect[2];
  lVar9 = fz->jstride;
  lVar10 = fz->kstride;
  lVar20 = wmac->jstride;
  iVar4 = (wmac->begin).y;
  iVar5 = (wmac->begin).z;
  lVar24 = wmac->kstride;
  iVar6 = (wmac->begin).x;
  pdVar13 = wmac->p;
  lVar29 = zed->kstride;
  lVar11 = zed->jstride;
  iVar7 = (bx->bigend).vect[0];
  iVar8 = (bx->bigend).vect[1];
  pdVar23 = fz->p + ((lVar21 + (lVar32 - (fz->begin).z) * lVar10 + (lVar30 - (fz->begin).y) * lVar9)
                    - (long)(fz->begin).x);
  lVar12 = fz->nstride;
  pdVar16 = zed->p + ((lVar21 + (lVar32 - (zed->begin).z) * lVar29 +
                                (lVar30 - (zed->begin).y) * lVar11) - (long)(zed->begin).x);
  lVar14 = zed->nstride;
  for (uVar34 = 0; lVar15 = lVar32,
      pdVar18 = pdVar13 + ((lVar21 + (lVar32 - iVar5) * lVar24 + (lVar30 - iVar4) * lVar20) -
                          (long)iVar6), pdVar25 = pdVar23, pdVar27 = pdVar16, uVar34 != uVar17;
      uVar34 = uVar34 + 1) {
    for (; lVar33 = lVar30, pdVar19 = pdVar18, pdVar26 = pdVar25, pdVar28 = pdVar27,
        lVar15 <= (int)(iVar22 + (uint)((uVar3 & 4) == 0)); lVar15 = lVar15 + 1) {
      for (; lVar33 <= iVar8; lVar33 = lVar33 + 1) {
        if (iVar2 <= iVar7) {
          lVar31 = 0;
          do {
            pdVar26[lVar31] = pdVar28[lVar31] * pdVar19[lVar31] * dVar35;
            lVar31 = lVar31 + 1;
          } while ((iVar7 - iVar2) + 1 != (int)lVar31);
        }
        pdVar26 = pdVar26 + lVar9;
        pdVar19 = pdVar19 + lVar20;
        pdVar28 = pdVar28 + lVar11;
      }
      pdVar18 = pdVar18 + lVar24;
      pdVar25 = pdVar25 + lVar10;
      pdVar27 = pdVar27 + lVar29;
    }
    pdVar23 = pdVar23 + lVar12;
    pdVar16 = pdVar16 + lVar14;
  }
  return;
}

Assistant:

void
HydroUtils::ComputeFluxes ( Box const& bx,
                            AMREX_D_DECL( Array4<Real> const& fx,
                                          Array4<Real> const& fy,
                                          Array4<Real> const& fz),
                            AMREX_D_DECL( Array4<Real const> const& umac,
                                          Array4<Real const> const& vmac,
                                          Array4<Real const> const& wmac),
                            AMREX_D_DECL( Array4<Real const> const& xed,
                                          Array4<Real const> const& yed,
                                          Array4<Real const> const& zed),
                            Geometry const& geom, const int ncomp,
                            const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const int ngrow_area = 0;
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_area);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& ax = (fluxes_are_area_weighted) ? area[0].const_array()
                                                    : Array4<const Real>{};
        const auto& ay = (fluxes_are_area_weighted) ? area[1].const_array()
                                                    : Array4<const Real>{};
        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, ax, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * ax(i,j,k);
            } else {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k);
            }
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, ay, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * ay(i,j,k);
            } else {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dx = geom.CellSizeArray();

        GpuArray<Real,AMREX_SPACEDIM> area;
#if ( AMREX_SPACEDIM == 3 )
        if (fluxes_are_area_weighted) {
            area[0] = dx[1]*dx[2];
            area[1] = dx[0]*dx[2];
            area[2] = dx[0]*dx[1];
        } else {
            area[0] = 1.; area[1] = 1.; area[2] = 1.;
        }
#else
        if (fluxes_are_area_weighted) {
            area[0] = dx[1];
            area[1] = dx[0];
        } else {
            area[0] = 1.; area[1] = 1.;
        }
#endif

        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * area[0];
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * area[1];
        });

#if ( AMREX_SPACEDIM == 3 )
        //
        //  Z flux
        //
        const Box& zbx = amrex::surroundingNodes(bx,2);
        amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * area[2];
        });
#endif
    }

}